

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

int insert(nghttp2_map_bucket *table,uint32_t tablelen,uint32_t tablelenbits,uint32_t hash,
          nghttp2_map_key_type key,void *data)

{
  nghttp2_map_bucket *bkt_00;
  size_t sVar1;
  nghttp2_map_bucket *bkt;
  size_t dd;
  size_t d;
  size_t idx;
  void *data_local;
  nghttp2_map_key_type key_local;
  uint32_t hash_local;
  uint32_t tablelenbits_local;
  uint32_t tablelen_local;
  nghttp2_map_bucket *table_local;
  
  idx = (size_t)data;
  data_local._0_4_ = key;
  data_local._4_4_ = hash;
  key_local = tablelenbits;
  hash_local = tablelen;
  _tablelenbits_local = table;
  d = h2idx(hash,tablelenbits);
  dd = 0;
  do {
    bkt_00 = _tablelenbits_local + d;
    if (bkt_00->data == (void *)0x0) {
      map_bucket_set_data(bkt_00,data_local._4_4_,(nghttp2_map_key_type)data_local,(void *)idx);
      return 0;
    }
    sVar1 = distance(hash_local,key_local,bkt_00,d);
    if (sVar1 < dd) {
      map_bucket_swap(bkt_00,(uint32_t *)((long)&data_local + 4),(nghttp2_map_key_type *)&data_local
                      ,(void **)&idx);
      dd = sVar1;
    }
    else if (bkt_00->key == (nghttp2_map_key_type)data_local) {
      return -0x1f5;
    }
    dd = dd + 1;
    d = d + 1 & (ulong)(hash_local - 1);
  } while( true );
}

Assistant:

static int insert(nghttp2_map_bucket *table, uint32_t tablelen,
                  uint32_t tablelenbits, uint32_t hash,
                  nghttp2_map_key_type key, void *data) {
  size_t idx = h2idx(hash, tablelenbits);
  size_t d = 0, dd;
  nghttp2_map_bucket *bkt;

  for (;;) {
    bkt = &table[idx];

    if (bkt->data == NULL) {
      map_bucket_set_data(bkt, hash, key, data);
      return 0;
    }

    dd = distance(tablelen, tablelenbits, bkt, idx);
    if (d > dd) {
      map_bucket_swap(bkt, &hash, &key, &data);
      d = dd;
    } else if (bkt->key == key) {
      /* TODO This check is just a waste after first swap or if this
         function is called from map_resize.  That said, there is no
         difference with or without this conditional in performance
         wise. */
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    ++d;
    idx = (idx + 1) & (tablelen - 1);
  }
}